

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_allreduce_2tree_multiple
          (bsc_step_t depends,bsc_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  bsc_step_t bVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar3;
  }
  bVar1 = depends;
  for (; uVar2 * 0x30 - uVar3 != 0; uVar3 = uVar3 + 0x30) {
    bVar1 = bsc_allreduce_qtree_single
                      (depends,group,*(void **)((long)&params->src + uVar3),
                       *(void **)((long)&params->dst + uVar3),*(void **)((long)&params->tmp + uVar3)
                       ,*(bsc_reduce_t *)((long)&params->reducer + uVar3),
                       *(void **)((long)&params->zero + uVar3),
                       *(bsc_size_t *)((long)&params->nmemb + uVar3),
                       *(bsc_size_t *)((long)&params->size + uVar3),2);
  }
  return bVar1;
}

Assistant:

bsc_step_t bsc_allreduce_2tree_multiple( bsc_step_t depends,
                      bsc_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    bsc_size_t i;
    bsc_step_t finished = depends;
    (void) root;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_allreduce_qtree_single( depends, group,
                   params[i].src, params[i].dst, params[i].tmp,
                   params[i].reducer, params[i].zero, 
                   params[i].nmemb, params[i].size, 2 );
    }

    return finished;
}